

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompression.cpp
# Opt level: O0

void anon_unknown.dwarf_762d5::fillPixels3(pixelArray *array,int width,int height)

{
  ostream *this;
  uint *puVar1;
  float *pfVar2;
  int in_EDX;
  int in_ESI;
  Array2D<unsigned_int> *in_RDI;
  double dVar3;
  double dVar4;
  int c;
  int x;
  int y;
  float in_stack_ffffffffffffffac;
  half *in_stack_ffffffffffffffb0;
  int local_1c;
  int local_18;
  int local_14;
  
  this = std::operator<<((ostream *)&std::cout,"pattern 2");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  for (local_14 = 0; local_14 < in_EDX; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < in_ESI; local_18 = local_18 + 1) {
      puVar1 = Imf_3_4::Array2D<unsigned_int>::operator[](in_RDI,(long)local_14);
      puVar1[local_18] = local_18 % 100 + (local_14 % 100) * 100;
      sin((double)local_18);
      sin((double)local_14 * 0.5);
      Imf_3_4::Array2D<Imath_3_2::half>::operator[]
                ((Array2D<Imath_3_2::half> *)(in_RDI + 2),(long)local_14);
      Imath_3_2::half::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      dVar3 = sin((double)local_14);
      dVar4 = sin((double)local_18 * 0.5);
      pfVar2 = Imf_3_4::Array2D<float>::operator[]((Array2D<float> *)(in_RDI + 1),(long)local_14);
      pfVar2[local_18] = (float)(dVar3 + dVar4);
      for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
        in_stack_ffffffffffffffb0 = (half *)sin((double)(local_18 + local_1c));
        sin((double)local_14 * 0.5);
        Imf_3_4::Array2D<Imath_3_2::half>::operator[]
                  ((Array2D<Imath_3_2::half> *)(in_RDI + (long)local_1c + 3),(long)local_14);
        Imath_3_2::half::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      }
    }
  }
  return;
}

Assistant:

void
fillPixels3 (pixelArray& array, int width, int height)
{
    cout << "pattern 2" << endl;

    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
        {

            array.i[y][x] = x % 100 + 100 * (y % 100);
            array.h[y][x] = sin (double (x)) + sin (y * 0.5);
            array.f[y][x] = sin (double (y)) + sin (x * 0.5);
            for (int c = 0; c < 4; ++c)
            {
                array.rgba[c][y][x] = sin (double (x + c)) + sin (y * 0.5);
            }
        }
}